

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O1

void __thiscall SimulationResult::Print(SimulationResult *this)

{
  ostream *poVar1;
  ulong uVar2;
  
  if ((ulong)((long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) < (ulong)this->_m_nr_stored) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"SimulationResult::Print error _m_nr_stored ",0x2b);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," > ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," _m_rewards.size() ",0x13);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SimulationResult::Print horizon ",0x20);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seed ",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->_m_random_seed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," entries ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SimulationResult::Print Rewards: ",0x21);
  if (this->_m_nr_stored != 0) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>
                         ((this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->_m_nr_stored);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SimulationResult::Print Average reward ",0x27);
  poVar1 = std::ostream::_M_insert<double>(this->_m_avg_reward);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void SimulationResult::Print(void)
{
    if(_m_nr_stored>_m_rewards.size())
        cerr << "SimulationResult::Print error _m_nr_stored " << _m_nr_stored  
             << " > " << " _m_rewards.size() " << _m_rewards.size() << endl;

    cout << "SimulationResult::Print horizon " << _m_horizon << " seed "
         << _m_random_seed << " entries " << _m_nr_stored << endl;
    cout << "SimulationResult::Print Rewards: ";
    for(unsigned int i=0;i<_m_nr_stored;i++)
        cout << _m_rewards[i] << " ";
    cout << endl;
    cout << "SimulationResult::Print Average reward " << _m_avg_reward << endl;
}